

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_EncryptAes256CbcByteData_Test::TestBody(CryptoUtil_EncryptAes256CbcByteData_Test *this)

{
  char *message;
  string local_a0;
  AssertHelper local_80;
  AssertionResult gtest_ar;
  ByteData byte_data;
  ByteData data;
  ByteData iv;
  ByteData key;
  
  std::__cxx11::string::string
            ((string *)&local_a0,"616975656F616975656F616975656F616975656F616975656F616975656F6169",
             (allocator *)&iv);
  cfd::core::ByteData::ByteData(&key,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string
            ((string *)&local_a0,"33343536373839303132333435363738",(allocator *)&data);
  cfd::core::ByteData::ByteData(&iv,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string
            ((string *)&local_a0,"74657374207465737420746573742074657374",(allocator *)&byte_data);
  cfd::core::ByteData::ByteData(&data,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  cfd::core::CryptoUtil::EncryptAes256Cbc(&byte_data,&key,&iv,&data);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a0,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22\"",
             local_a0._M_dataplus._M_p,
             "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
  std::__cxx11::string::~string((string *)&local_a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0xc1,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&iv);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256CbcByteData) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData iv("33343536373839303132333435363738");
  ByteData data("74657374207465737420746573742074657374");
  ByteData byte_data = CryptoUtil::EncryptAes256Cbc(key, iv, data);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
}